

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportGlobal
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  allocator<char> local_fa;
  allocator<char> local_f9;
  undefined1 local_f8 [8];
  string_view field_name_local;
  string_view module_name_local;
  GlobalType global_type;
  string local_b8;
  string local_98;
  Location loc;
  
  field_name_local._M_str = field_name._M_str;
  field_name_local._M_len = field_name._M_len;
  module_name_local._M_str = module_name._M_str;
  module_name_local._M_len = module_name._M_len;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnGlobalImport(&this->validator_,&loc,type,mutable_);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    global_type.super_ExternType.kind = Global;
    global_type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001801c0;
    global_type._12_8_ = type;
    pMVar1 = this->module_;
    global_type.mut = (uint)mutable_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_98,&module_name_local,&local_f9);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_b8,&field_name_local,&local_fa);
    GlobalType::Clone((GlobalType *)local_f8);
    ImportType::ImportType
              ((ImportType *)&loc,&local_98,&local_b8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_f8);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&loc);
    ImportType::~ImportType((ImportType *)&loc);
    if (local_f8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_f8 + 8))();
    }
    local_f8 = (undefined1  [8])0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,&global_type);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportGlobal(Index import_index,
                                          std::string_view module_name,
                                          std::string_view field_name,
                                          Index global_index,
                                          Type type,
                                          bool mutable_) {
  CHECK_RESULT(validator_.OnGlobalImport(GetLocation(), type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), global_type.Clone())});
  global_types_.push_back(global_type);
  return Result::Ok;
}